

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O0

vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
* __thiscall
spvtools::opt::StructPackingPass::findStructMemberTypes
          (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
           *__return_storage_ptr__,StructPackingPass *this,Instruction *structDef)

{
  uint32_t uVar1;
  uint32_t id;
  Operand *this_00;
  IRContext *this_01;
  TypeManager *this_02;
  Type *pTVar2;
  reference ppTVar3;
  Type *memberType;
  Id memberTypeId;
  uint32_t i;
  uint32_t numMembers;
  Instruction *structDef_local;
  StructPackingPass *this_local;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *structMemberTypes;
  
  uVar1 = opt::Instruction::NumOperands(structDef);
  if (uVar1 == 0) {
    __assert_fail("structDef.NumOperands() > 0 && \"Number of operands in OpTypeStruct instruction must not be zero\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/struct_packing_pass.cpp"
                  ,0x18b,
                  "std::vector<const analysis::Type *> spvtools::opt::StructPackingPass::findStructMemberTypes(const Instruction &) const"
                 );
  }
  uVar1 = opt::Instruction::NumOperands(structDef);
  std::
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ::resize(__return_storage_ptr__,(ulong)(uVar1 - 1));
  for (memberType._4_4_ = 0; memberType._4_4_ < uVar1 - 1; memberType._4_4_ = memberType._4_4_ + 1)
  {
    this_00 = opt::Instruction::GetOperand(structDef,memberType._4_4_ + 1);
    id = Operand::AsId(this_00);
    this_01 = Pass::context(&this->super_Pass);
    this_02 = IRContext::get_type_mgr(this_01);
    pTVar2 = analysis::TypeManager::GetType(this_02,id);
    if (pTVar2 != (Type *)0x0) {
      ppTVar3 = std::
                vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                ::operator[](__return_storage_ptr__,(ulong)memberType._4_4_);
      *ppTVar3 = pTVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const analysis::Type*> StructPackingPass::findStructMemberTypes(
    const Instruction& structDef) const {
  // Found struct type to pack, now collect all types of its members
  assert(structDef.NumOperands() > 0 &&
         "Number of operands in OpTypeStruct instruction must not be zero");
  const uint32_t numMembers = structDef.NumOperands() - 1;
  std::vector<const analysis::Type*> structMemberTypes;
  structMemberTypes.resize(numMembers);
  for (uint32_t i = 0; i < numMembers; ++i) {
    const spv::Id memberTypeId = structDef.GetOperand(1 + i).AsId();
    if (const analysis::Type* memberType =
            context()->get_type_mgr()->GetType(memberTypeId)) {
      structMemberTypes[i] = memberType;
    }
  }
  return structMemberTypes;
}